

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,binary_expression *e)

{
  wostream *pwVar1;
  token_type tVar2;
  int iVar3;
  expression *peVar4;
  literal_expression *this_00;
  token *this_01;
  wstring *pwVar5;
  char *pcVar6;
  token *t;
  int precedence;
  binary_expression *e_local;
  print_visitor *this_local;
  
  tVar2 = binary_expression::op(e);
  iVar3 = operator_precedence(tVar2);
  peVar4 = binary_expression::lhs(e);
  print_with_parentheses(this,peVar4,iVar3);
  tVar2 = binary_expression::op(e);
  if (tVar2 == lbracket) {
    std::operator<<(this->os_,'[');
    peVar4 = binary_expression::rhs(e);
    accept<mjs::print_visitor>(peVar4,this);
    std::operator<<(this->os_,']');
  }
  else {
    tVar2 = binary_expression::op(e);
    if (tVar2 == dot) {
      std::operator<<(this->os_,'.');
      peVar4 = binary_expression::rhs(e);
      iVar3 = (*(peVar4->super_syntax_node)._vptr_syntax_node[3])();
      if (iVar3 == 2) {
        this_00 = (literal_expression *)binary_expression::rhs(e);
        this_01 = literal_expression::t(this_00);
        tVar2 = token::type(this_01);
        if (tVar2 == string_literal) {
          pwVar1 = this->os_;
          pwVar5 = token::text_abi_cxx11_(this_01);
          std::operator<<(pwVar1,(wstring *)pwVar5);
          return;
        }
      }
      peVar4 = binary_expression::rhs(e);
      accept<mjs::print_visitor>(peVar4,this);
    }
    else {
      pwVar1 = this->os_;
      tVar2 = binary_expression::op(e);
      pcVar6 = op_text(tVar2);
      std::operator<<(pwVar1,pcVar6);
      peVar4 = binary_expression::rhs(e);
      print_with_parentheses(this,peVar4,iVar3);
    }
  }
  return;
}

Assistant:

void operator()(const binary_expression& e) {
        const int precedence = operator_precedence(e.op());
        print_with_parentheses(e.lhs(), precedence);
        if (e.op() == token_type::lbracket) {
            os_ << '[';
            accept(e.rhs(), *this);
            os_ << ']';
        } else if (e.op() == token_type::dot) {
            os_ << '.';
            if (e.rhs().type() == expression_type::literal) {
                if (const auto& t = static_cast<const literal_expression&>(e.rhs()).t(); t.type() == token_type::string_literal) {
                    os_ << t.text();
                    return;
                }
            }
            accept(e.rhs(), *this);
        } else {
            os_ << op_text(e.op());
            print_with_parentheses(e.rhs(), precedence);
        }
    }